

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cia.c
# Opt level: O1

void write_struct_with_padding(FILE *fd,void *data,size_t sz)

{
  size_t __n;
  uint8_t zero [64];
  undefined1 auStack_58 [64];
  
  fwrite(data,sz,1,(FILE *)fd);
  __n = (sz + 0x3f & 0xffffffffffffffc0) - sz;
  if (__n != 0) {
    memset(auStack_58,0,__n);
    fwrite(auStack_58,1,__n,(FILE *)fd);
  }
  return;
}

Assistant:

static void write_struct_with_padding(FILE *fd, const void *data, size_t sz) {
    size_t pad_size = (size_t)(((sz + 0x3F) & ~0x3FULL) - sz);
    fwrite(data, sz, 1, fd);
    if (pad_size > 0) {
        uint8_t zero[0x40];
        memset(zero, 0, pad_size);
        fwrite(zero, 1, pad_size, fd);
    }
}